

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O0

void put_raw_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  ushort uVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  code_int c;
  JDIMENSION col;
  JSAMPROW ptr;
  gif_dest_ptr dest;
  code_int in_stack_ffffffffffffffce;
  undefined2 in_stack_ffffffffffffffd0;
  byte *local_28;
  
  local_28 = (byte *)**(undefined8 **)(in_RSI + 0x28);
  for (iVar2 = *(int *)(in_RDI + 0x88); iVar2 != 0; iVar2 = iVar2 + -1) {
    uVar1 = (ushort)*local_28;
    output((gif_dest_ptr)CONCAT44(iVar2,(uint)CONCAT12(*local_28,in_stack_ffffffffffffffd0)),
           in_stack_ffffffffffffffce);
    if (*(short *)(in_RSI + 0x62) < *(short *)(in_RSI + 0x44)) {
      *(short *)(in_RSI + 0x62) = *(short *)(in_RSI + 0x62) + 1;
    }
    else {
      output((gif_dest_ptr)CONCAT44(iVar2,CONCAT22(uVar1,in_stack_ffffffffffffffd0)),
             in_stack_ffffffffffffffce);
      *(short *)(in_RSI + 0x62) = *(short *)(in_RSI + 0x5c) + 2;
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
put_raw_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                   JDIMENSION rows_supplied)
{
  gif_dest_ptr dest = (gif_dest_ptr)dinfo;
  register JSAMPROW ptr;
  register JDIMENSION col;
  code_int c;

  ptr = dest->pub.buffer[0];
  for (col = cinfo->output_width; col > 0; col--) {
    c = (code_int)(*ptr++);
    /* Accept and output one pixel value.
     * The given value must be less than n_bits wide.
     */

    /* Output the given pixel value as a symbol. */
    output(dest, c);
    /* Issue Clear codes often enough to keep the reader from ratcheting up
     * its symbol size.
     */
    if (dest->code_counter < dest->maxcode) {
      dest->code_counter++;
    } else {
      output(dest, dest->ClearCode);
      dest->code_counter = dest->ClearCode + 2; /* reset the counter */
    }
  }
}